

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BarrierTests.cpp
# Opt level: O2

void __thiscall barrier_basic_Test::TestBody(barrier_basic_Test *this)

{
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar1;
  _Result<void> *p_Var2;
  pointer *__ptr;
  char *pcVar3;
  _State_baseV2 *__tmp;
  __state_type local_118;
  AssertionResult gtest_ar;
  atomic<int> count;
  AssertHelper local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  __allocator_type __a2_2;
  __allocator_type __a2_3;
  __allocator_type __a2;
  future<void> fut2;
  future<void> fut1;
  Barrier barrier1;
  
  gmlc::concurrency::Barrier::Barrier(&barrier1,2);
  count.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tVar1.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )operator_new(0x58);
  *(undefined8 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 8) = 0x100000001;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   .
   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
   ._M_head_impl = &PTR___Sp_counted_ptr_inplace_00162550;
  *(undefined8 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x18) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x20) = 0;
  *(undefined1 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x24) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x28) = 0;
  gtest_ar._0_8_ = &__a2;
  *(undefined8 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x38) = 0;
  *(undefined ***)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x10) = &PTR___Async_state_impl_001625a0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )tVar1.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  p_Var2 = (_Result<void> *)operator_new(0x10);
  *(undefined8 *)p_Var2 = 0;
  *(undefined8 *)&p_Var2->field_0x8 = 0;
  std::__future_base::_Result<void>::_Result(p_Var2);
  *(_Result<void> **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x40) = p_Var2;
  *(Barrier **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x48) = &barrier1;
  *(atomic<int> **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x50) = &count;
  ___a2_3 = (long *)0x0;
  fut2.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0x20);
  (fut2.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)&PTR___State_001625f8;
  ((fut2.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       ((long)tVar1.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl + 0x10);
  *(code **)&(fut2.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->_M_status =
       std::__future_base::
       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:26:48)>_>,_void>
       ::_M_run;
  *(undefined8 *)
   &(fut2.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once = 0;
  std::thread::_M_start_thread(&__a2_3,&fut2,0);
  if (fut2.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*(fut2.super___basic_future<void>._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr__State_baseV2[1])();
  }
  std::thread::operator=
            ((thread *)
             ((long)tVar1.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x30),(thread *)&__a2_3);
  std::thread::~thread((thread *)&__a2_3);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:26:48)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:26:48)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_GMLC_TDC[P]concurrency_tests_BarrierTests_cpp:26:48)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_GMLC_TDC[P]concurrency_tests_BarrierTests_cpp:26:48)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&gtest_ar);
  local_e8.data_ = (AssertHelperData *)0x0;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gtest_ar._0_8_ =
       local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_118.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         ((long)tVar1.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl + 0x10);
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       tVar1.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
  if (local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )operator_new(0x48);
    *(size_type *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 8) = 0x100000001;
    *(undefined ***)
     tVar1.
     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
     ._M_head_impl = &PTR___Sp_counted_ptr_inplace_00162638;
    *(undefined8 *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x18) = 0;
    *(undefined4 *)
     &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)tVar1.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl + 0x20))->_M_dataplus)._M_p = 0;
    *(undefined1 *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x24) = 0;
    *(undefined4 *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x28) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)tVar1.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl + 0x10))->_M_allocated_capacity =
         (size_type)&PTR___Deferred_state_00162688;
    gtest_ar._0_8_ = &fut2;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )tVar1.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    p_Var2 = (_Result<void> *)operator_new(0x10);
    *(undefined8 *)p_Var2 = 0;
    *(undefined8 *)&p_Var2->field_0x8 = 0;
    std::__future_base::_Result<void>::_Result(p_Var2);
    *(_Result<void> **)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x30) = p_Var2;
    *(Barrier **)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x38) = &barrier1;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x40))->_M_dataplus)._M_p = (pointer)&count;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:26:48)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:26:48)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_GMLC_TDC[P]concurrency_tests_BarrierTests_cpp:26:48)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_GMLC_TDC[P]concurrency_tests_BarrierTests_cpp:26:48)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&gtest_ar);
    local_e8.data_ = (AssertHelperData *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    gtest_ar._0_8_ =
         local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_118.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ((long)tVar1.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10);
    local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
  }
  std::__basic_future<void>::__basic_future(&fut1.super___basic_future<void>,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&gtest_ar);
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         CONCAT44(local_118.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,count.super___atomic_base<int>._M_i);
  local_e8.data_ = local_e8.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"count.load()","0",(int *)&local_118,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp"
               ,0x1f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*(local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_vptr__State_baseV2[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tVar1.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )operator_new(0x58);
  *(undefined8 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 8) = 0x100000001;
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
   .
   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
   ._M_head_impl = &PTR___Sp_counted_ptr_inplace_001626d0;
  *(undefined8 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x18) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x20) = 0;
  *(undefined1 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x24) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x28) = 0;
  gtest_ar._0_8_ = &__a2_2;
  *(undefined8 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x30) = 0;
  *(undefined4 *)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x38) = 0;
  *(undefined ***)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x10) = &PTR___Async_state_impl_00162720;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )tVar1.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  p_Var2 = (_Result<void> *)operator_new(0x10);
  *(undefined8 *)p_Var2 = 0;
  *(undefined8 *)&p_Var2->field_0x8 = 0;
  std::__future_base::_Result<void>::_Result(p_Var2);
  *(_Result<void> **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x40) = p_Var2;
  *(Barrier **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x48) = &barrier1;
  *(atomic<int> **)
   ((long)tVar1.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl + 0x50) = &count;
  ___a2 = 0;
  ___a2_3 = (long *)operator_new(0x20);
  *___a2_3 = (long)&PTR___State_00162778;
  ___a2_3[1] = (long)tVar1.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 0x10;
  ___a2_3[2] = (long)std::__future_base::
                     _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:32:48)>_>,_void>
                     ::_M_run;
  ___a2_3[3] = 0;
  std::thread::_M_start_thread(&__a2,&__a2_3,0);
  if (___a2_3 != (long *)0x0) {
    (**(code **)(*___a2_3 + 8))();
  }
  std::thread::operator=
            ((thread *)
             ((long)tVar1.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x30),(thread *)&__a2);
  std::thread::~thread((thread *)&__a2);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:32:48)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:32:48)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_GMLC_TDC[P]concurrency_tests_BarrierTests_cpp:32:48)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_GMLC_TDC[P]concurrency_tests_BarrierTests_cpp:32:48)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&gtest_ar);
  local_e8.data_ = (AssertHelperData *)0x0;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  gtest_ar._0_8_ =
       local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_118.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         ((long)tVar1.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl + 0x10);
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       tVar1.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
  if (local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    tVar1.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )operator_new(0x48);
    *(size_type *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 8) = 0x100000001;
    *(undefined ***)
     tVar1.
     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     .
     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
     ._M_head_impl = &PTR___Sp_counted_ptr_inplace_001627b8;
    *(undefined8 *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x18) = 0;
    *(undefined4 *)
     &(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)tVar1.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl + 0x20))->_M_dataplus)._M_p = 0;
    *(undefined1 *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x24) = 0;
    *(undefined4 *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x28) = 0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)tVar1.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl + 0x10))->_M_allocated_capacity =
         (size_type)&PTR___Deferred_state_00162808;
    gtest_ar._0_8_ = &__a2_3;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )tVar1.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    p_Var2 = (_Result<void> *)operator_new(0x10);
    *(undefined8 *)p_Var2 = 0;
    *(undefined8 *)&p_Var2->field_0x8 = 0;
    std::__future_base::_Result<void>::_Result(p_Var2);
    *(_Result<void> **)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x30) = p_Var2;
    *(Barrier **)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x38) = &barrier1;
    (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
     ((long)tVar1.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl + 0x40))->_M_dataplus)._M_p = (pointer)&count;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:32:48)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp:32:48)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_GMLC_TDC[P]concurrency_tests_BarrierTests_cpp:32:48)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_GMLC_TDC[P]concurrency_tests_BarrierTests_cpp:32:48)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&gtest_ar);
    local_e8.data_ = (AssertHelperData *)0x0;
    _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    gtest_ar._0_8_ =
         local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )local_118.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             ((long)tVar1.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl + 0x10);
    local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         tVar1.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
  }
  std::__basic_future<void>::__basic_future(&fut2.super___basic_future<void>,&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_118.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&gtest_ar);
  local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)
         CONCAT44(local_118.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr._4_4_,count.super___atomic_base<int>._M_i);
  local_e8.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"count.load()","2",(int *)&local_118,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/BarrierTests.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      (*(local_118.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_vptr__State_baseV2[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::future<void>::get(&fut2);
  std::future<void>::get(&fut1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fut2.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&fut1.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::condition_variable::~condition_variable(&barrier1.cv);
  return;
}

Assistant:

TEST(barrier, basic)
{
    Barrier barrier1(2);
    std::atomic<int> count{0};
    auto fut1 = std::async(std::launch::async, [&barrier1, &count]() {
        barrier1.wait();
        ++count;
    });
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    EXPECT_EQ(count.load(), 0);
    auto fut2 = std::async(std::launch::async, [&barrier1, &count]() {
        barrier1.wait();
        ++count;
    });
    std::this_thread::sleep_for(std::chrono::milliseconds(50));
    EXPECT_EQ(count.load(), 2);
    fut2.get();
    fut1.get();
}